

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# paramsurface.hpp
# Opt level: O3

bool __thiscall ParamSurface::intersect(ParamSurface *this,Ray *ray,Hit *result)

{
  float fVar1;
  undefined4 uVar2;
  undefined4 uVar3;
  bool bVar4;
  vec2f vVar5;
  int iVar6;
  undefined8 *puVar7;
  ulong uVar8;
  ulong uVar9;
  int _;
  uint uVar10;
  uint uVar11;
  long lVar12;
  long lVar13;
  long lVar14;
  ulong uVar15;
  ulong uVar16;
  float fVar17;
  undefined8 extraout_XMM0_Qa;
  undefined8 extraout_XMM0_Qa_00;
  undefined1 auVar18 [16];
  float fVar19;
  undefined1 auVar20 [16];
  float fVar21;
  float fVar22;
  float fVar23;
  float fVar24;
  mat3f res;
  Hit tmpresult;
  Ray forwardray;
  float local_11c;
  float local_118;
  float fStack_114;
  float local_110;
  float local_108;
  float fStack_104;
  float local_100;
  undefined8 local_f8;
  float fStack_f0;
  float fStack_ec;
  float local_e8;
  float fStack_e4;
  float fStack_e0;
  float fStack_dc;
  float local_d8;
  float local_d0 [4];
  float local_c0;
  float local_bc;
  float local_b8;
  float local_b4;
  float local_b0;
  float local_a8;
  float fStack_a4;
  undefined4 uStack_a0;
  undefined4 uStack_9c;
  Hit *local_98;
  undefined1 local_90;
  undefined8 local_8c;
  undefined8 uStack_84;
  undefined8 local_7c;
  undefined8 uStack_74;
  undefined4 local_6c;
  float fStack_68;
  float fStack_64;
  undefined4 uStack_60;
  undefined8 local_5c;
  undefined8 uStack_54;
  undefined4 local_4c;
  undefined8 local_48;
  float local_40;
  undefined8 local_3c;
  float local_34;
  
  local_90 = 0;
  local_8c = 0;
  uStack_84 = 0;
  local_7c = 0;
  uStack_74 = 0;
  local_6c = 0;
  fStack_68 = 0.0;
  fStack_64 = 0.0;
  uStack_60 = 0;
  local_5c = 0;
  uStack_54 = 0;
  local_4c = 0;
  local_34 = (ray->dir).z;
  local_3c._0_4_ = (ray->dir).x;
  local_3c._4_4_ = (ray->dir).y;
  uVar2 = (ray->origin).x;
  uVar3 = (ray->origin).y;
  local_40 = local_34 * 0.01 + (ray->origin).z;
  local_48 = CONCAT44((float)uVar3 + (float)local_3c._4_4_ * 0.01,
                      (float)uVar2 + (float)(undefined4)local_3c * 0.01);
  iVar6 = (**(this->mesh->super_Primitive)._vptr_Primitive)();
  uVar16 = 0;
  if ((char)iVar6 != '\0') {
    fVar17 = (float)local_8c - (ray->origin).x;
    fVar19 = local_8c._4_4_ - (ray->origin).y;
    fVar21 = (float)uStack_84 - (ray->origin).z;
    auVar20._0_8_ = (double)fStack_68;
    auVar20._8_8_ = (double)fStack_64;
    auVar20 = maxpd(auVar20,_DAT_00153020);
    auVar20 = minpd(auVar20,_DAT_00155790);
    local_11c = SQRT(fVar21 * fVar21 + fVar17 * fVar17 + fVar19 * fVar19);
    local_108 = 0.0;
    fStack_104 = 0.0;
    local_100 = 0.0;
    local_118 = 0.0;
    fStack_114 = 0.0;
    local_a8 = (float)auVar20._0_8_;
    fVar17 = (float)auVar20._8_8_;
    local_110 = 0.0;
    iVar6 = 0;
    local_98 = result;
    do {
      uStack_a0 = 0;
      uStack_9c = 0;
      fStack_a4 = fVar17;
      (*(this->super_Primitive)._vptr_Primitive[3])(this,&local_108,&local_118);
      fVar19 = (ray->dir).x;
      fVar21 = (ray->dir).y;
      fVar24 = (ray->dir).z;
      fVar23 = (ray->origin).x;
      fVar1 = (ray->origin).z;
      fVar22 = (float)((ulong)extraout_XMM0_Qa >> 0x20) - (local_11c * fVar21 + (ray->origin).y);
      local_d0[0] = -fVar19;
      local_d0[1] = local_108;
      local_d0[2] = local_118;
      local_d0[3] = -fVar21;
      local_c0 = fStack_104;
      local_bc = fStack_114;
      local_b8 = -fVar24;
      local_b4 = local_100;
      local_b0 = local_110;
      local_f8 = 0;
      fStack_f0 = 0.0;
      fStack_ec = 0.0;
      local_e8 = 0.0;
      fStack_e4 = 0.0;
      fStack_e0 = 0.0;
      fStack_dc = 0.0;
      local_d8 = 0.0;
      puVar7 = &local_f8;
      uVar15 = 0;
      do {
        uVar8 = uVar15 + 1;
        uVar9 = uVar8;
        if (uVar8 == 3) {
          uVar9 = uVar16;
        }
        uVar10 = ((int)uVar15 + 2U) % 3;
        uVar11 = 0xffffffff;
        lVar12 = 1;
        lVar13 = 0;
        do {
          lVar14 = 0;
          if (lVar13 != 0x18) {
            lVar14 = lVar12;
          }
          uVar15 = (ulong)uVar11;
          if (lVar13 == 0) {
            uVar15 = 2;
          }
          *(float *)((long)puVar7 + lVar13) =
               (local_d0[uVar9 * 3 + lVar14] * local_d0[(ulong)uVar10 * 3 + uVar15] -
               local_d0[uVar9 * 3 + uVar15] * local_d0[(ulong)uVar10 * 3 + lVar14]) *
               (1.0 / (fStack_104 * local_118 * fVar24 +
                      fVar21 * local_108 * local_110 +
                      fStack_114 * fVar19 * local_100 +
                      ((-fVar19 * fStack_104 * local_110 - local_108 * fStack_114 * fVar24) -
                      local_118 * fVar21 * local_100)));
          lVar13 = lVar13 + 0xc;
          uVar11 = uVar11 + 1;
          lVar12 = lVar12 + 1;
        } while (lVar13 != 0x24);
        puVar7 = (undefined8 *)((long)puVar7 + 4);
        uVar15 = uVar8;
      } while (uVar8 != 3);
      fVar19 = (float)extraout_XMM0_Qa - (fVar19 * local_11c + fVar23);
      fVar17 = fVar17 - (fVar24 * local_11c + fVar1);
      local_11c = local_11c -
                  (fStack_f0 * fVar17 + (float)local_f8 * fVar19 + local_f8._4_4_ * fVar22);
      auVar18._0_8_ =
           (double)(local_a8 - (fVar17 * fStack_e4 + fVar19 * fStack_ec + local_e8 * fVar22));
      auVar18._8_8_ =
           (double)(fStack_a4 - (fVar17 * local_d8 + fVar19 * fStack_e0 + fStack_dc * fVar22));
      auVar20 = maxpd(auVar18,ZEXT816(0));
      auVar20 = minpd(auVar20,_DAT_00155790);
      iVar6 = iVar6 + 1;
      local_a8 = (float)auVar20._0_8_;
      fVar17 = (float)auVar20._8_8_;
    } while (iVar6 != 5);
    uStack_a0 = 0;
    uStack_9c = 0;
    fStack_a4 = fVar17;
    (*(this->super_Primitive)._vptr_Primitive[3])(this,&local_108,&local_118);
    fVar24 = (float)extraout_XMM0_Qa_00 - ((ray->dir).x * local_11c + (ray->origin).x);
    fVar19 = (float)((ulong)extraout_XMM0_Qa_00 >> 0x20) -
             ((ray->dir).y * local_11c + (ray->origin).y);
    fVar21 = fVar17 - ((ray->dir).z * local_11c + (ray->origin).z);
    bVar4 = SQRT(fVar21 * fVar21 + fVar24 * fVar24 + fVar19 * fVar19) < 1e-06;
    uVar16 = (ulong)(0.0 < local_11c && bVar4);
    if (0.0 < local_11c && bVar4) {
      fVar21 = local_110 * fStack_104 - local_100 * fStack_114;
      fVar24 = local_118 * local_100 - local_108 * local_110;
      fVar19 = local_108 * fStack_114 - local_118 * fStack_104;
      fVar23 = 1.0 / SQRT(fVar19 * fVar19 + fVar21 * fVar21 + fVar24 * fVar24);
      local_98->hit = true;
      (local_98->p).x = (float)(int)extraout_XMM0_Qa_00;
      (local_98->p).y = (float)(int)((ulong)extraout_XMM0_Qa_00 >> 0x20);
      (local_98->p).z = fVar17;
      (local_98->Ns).x = fVar23 * fVar21;
      (local_98->Ns).y = fVar23 * fVar24;
      (local_98->Ns).z = fVar19 * fVar23;
      (local_98->Ng).x = fVar23 * fVar21;
      (local_98->Ng).y = fVar23 * fVar24;
      (local_98->Ng).z = fVar19 * fVar23;
      vVar5.y = fStack_a4;
      vVar5.x = local_a8;
      local_98->uv = vVar5;
      (local_98->dpdu).x = 0.0;
      (local_98->dpdu).y = 0.0;
      *(undefined8 *)&(local_98->dpdu).z = 0;
      (local_98->dpdv).y = 0.0;
      (local_98->dpdv).z = 0.0;
    }
  }
  return SUB81(uVar16,0);
}

Assistant:

bool intersect(const Ray& ray, Hit* result) const
	{
		Hit tmpresult;
		Ray forwardray (ray.atParam(1e-2), ray.dir);
		bool boolres = mesh->intersect(forwardray, &tmpresult);
		if (!boolres) return false;
		// determine initial point
		float t = norm(tmpresult.p - ray.origin);
		float u = tmpresult.uv.x;
		float v = tmpresult.uv.y;
		u = fmin(1, fmax(0, u));
		v = fmin(1, fmax(0, v));
		vec3f p, dpdu, dpdv;
		// solve eqn(t,u,v): f(u,v) - origin - t * dir = 0
		for (int _=0; _<5; ++_)
		{
			p = surface(u,v,dpdu,dpdv) - ray.atParam(t);
			// vec3f t1,t2;
			// auto dpdu1 = (surface(u+1e-4,v,t1,t2)-surface(u,v,dpdu,dpdv))/1e-4;
			// auto dpdv1 = (surface(u,v+1e-4,t1,t2)-surface(u,v,dpdu,dpdv))/1e-4;
			// console.log(u,v);
			// console.log(dpdu, dpdv);
			// console.log(dpdu1, dpdv1);
			// console.log(norm(dpdu-dpdu1)/norm(dpdu), norm(dpdv-dpdv1)/norm(dpdv));
			// console.log(_,":",norm(p),",  ",t,u,v);
			// for (int i=0; i<3; ++i) for (int j=0; j<3; ++j)
			// console.log((inverse(mat3f(-ray.dir, dpdu, dpdv))*mat3f(-ray.dir, dpdu, dpdv))[i][j]);
			vec3f delt = inverse(mat3f(-ray.dir, dpdu, dpdv)) * p;
			t -= delt.x;
			u = fmin(1, fmax(0, u - delt.y));
			// v = v - delt.z;
			v = fmin(1, fmax(0, v - delt.z));
		}
		p = surface(u,v,dpdu,dpdv);
		if (norm(p-ray.atParam(t)) < 1e-6 && t>0) {
			vec3f N = normalized(cross(dpdu,dpdv));
			*result = {p,N,N,vec2f(u,v)};
			return true;
		}
		return false;
	}